

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_and_relation.cpp
# Opt level: O0

int textinput(void)

{
  byte bVar1;
  ostream *poVar2;
  int local_10;
  char local_9;
  int count;
  char ch;
  
  local_10 = 0;
  std::operator>>((istream *)&std::cin,&local_9);
  std::istream::get((char *)&std::cin);
  while( true ) {
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) != 0) break;
    std::operator<<((ostream *)&std::cout,local_9);
    local_10 = local_10 + 1;
    std::istream::get((char *)&std::cin);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\n");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  std::operator<<(poVar2," charactors readed.");
  return 0;
}

Assistant:

int textinput () {
    using namespace std;

    char ch;
    int count = 0;

//    cout << "Enter something, enter # to stop:\n";
//    cout << "Enter something:\n";
    cin >> ch;
    //  cin.get() 可以获取空格、换行
    cin.get(ch);

    //  检测EOF： cin.fail() == true
    while (cin.fail() == false) {
        cout << ch;
        ++count;
//        cin >> ch;
        cin.get(ch);
    }

    cout << "\n" << count << " charactors readed.";

    return 0;
}